

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcts.h
# Opt level: O0

Node<NimState> * __thiscall
MCTS::Node<NimState>::add_child(Node<NimState> *this,Move *move,TestGame *state)

{
  bool bVar1;
  Node<NimState> *__new_size;
  reference piVar2;
  iterator this_00;
  int *in_RSI;
  Node<NimState> *in_RDI;
  iterator itr;
  Node<NimState> *node;
  int in_stack_000001d4;
  char *in_stack_000001d8;
  char *in_stack_000001e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined1 uVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38 [3];
  Node<NimState> *local_20;
  int *local_10;
  
  local_10 = in_RSI;
  __new_size = (Node<NimState> *)operator_new(0x60);
  Node(in_RDI,(TestGame *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
       in_stack_ffffffffffffff80._M_current,(Node<NimState> *)in_stack_ffffffffffffff78._M_current);
  local_20 = __new_size;
  std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::push_back
            ((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)in_RDI,
             (value_type *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
  bVar1 = std::vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_>::empty
                    ((vector<MCTS::Node<NimState>_*,_std::allocator<MCTS::Node<NimState>_*>_> *)
                     in_RDI);
  if (bVar1) {
    assertion_failed(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  }
  local_38[0]._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78._M_current);
  while( true ) {
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78._M_current);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff80._M_current,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff78._M_current);
    uVar3 = false;
    if (bVar1) {
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(local_38);
      uVar3 = *piVar2 != *local_10;
    }
    if ((bool)uVar3 == false) break;
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (local_38);
  }
  std::vector<int,_std::allocator<int>_>::end
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff78._M_current);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff80._M_current,
                     (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     in_stack_ffffffffffffff78._M_current);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    assertion_failed(in_stack_000001e0,in_stack_000001d8,in_stack_000001d4);
  }
  this_00 = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78._M_current);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator-
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffff88),
             (difference_type)in_stack_ffffffffffffff80._M_current);
  std::
  iter_swap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<int,_std::allocator<int>_>::size(&in_RDI->moves);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00._M_current,(size_type)__new_size);
  return local_20;
}

Assistant:

Node<State>* Node<State>::add_child(const Move& move, const State& state)
{
	auto node = new Node(state, move, this);
	children.push_back(node);
	attest( ! children.empty());

	auto itr = moves.begin();
	for (; itr != moves.end() && *itr != move; ++itr);
	attest(itr != moves.end());
	std::iter_swap(itr, moves.end() - 1);
	moves.resize(moves.size() - 1);
	return node;
}